

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O0

void __thiscall SVGChart::StringData::AddItem(StringData *this,char *inString)

{
  size_type sVar1;
  float local_74;
  float local_50 [5];
  allocator<char> local_39;
  value_type local_38;
  char *local_18;
  char *inString_local;
  StringData *this_local;
  
  local_18 = inString;
  inString_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,inString,&local_39);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->mStringData,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->mStringData);
  local_74 = (float)(sVar1 - 1);
  local_50[0] = local_74;
  std::vector<float,_std::allocator<float>_>::push_back(&this->mRealPlotData,local_50);
  return;
}

Assistant:

void StringData::AddItem (const char *inString) {
      mStringData.push_back (inString);
      mRealPlotData.push_back (mStringData.size ()-1);
    }